

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_data.c
# Opt level: O3

void ares_free_data(void *dataptr)

{
  undefined8 *p;
  void *pvVar1;
  undefined8 *puVar2;
  
  if (dataptr != (void *)0x0) {
    do {
      if (*(int *)((long)dataptr + -4) != 0xbead) {
        return;
      }
      p = (undefined8 *)((long)dataptr + -8);
      switch(*(undefined4 *)p) {
      case 2:
      case 3:
      case 4:
      case 6:
        puVar2 = *dataptr;
        pvVar1 = *(void **)((long)dataptr + 8);
        break;
      case 5:
      case 10:
        puVar2 = *dataptr;
        goto LAB_0010f4fe;
      case 7:
        puVar2 = *dataptr;
        ares_free(*(void **)((long)dataptr + 8));
        ares_free(*(void **)((long)dataptr + 0x10));
        pvVar1 = *(void **)((long)dataptr + 0x18);
        goto LAB_0010f4ed;
      case 8:
        ares_free(*dataptr);
        ares_free(*(void **)((long)dataptr + 8));
        ares_free(p);
        return;
      case 9:
        puVar2 = *dataptr;
        pvVar1 = *(void **)((long)dataptr + 0x10);
        break;
      case 0xb:
        puVar2 = *dataptr;
        pvVar1 = *(void **)((long)dataptr + 0x10);
LAB_0010f4ed:
        ares_free(pvVar1);
        pvVar1 = *(void **)((long)dataptr + 0x20);
        break;
      default:
        goto switchD_0010f4b2_default;
      }
      ares_free(pvVar1);
LAB_0010f4fe:
      ares_free(p);
      dataptr = puVar2;
    } while (puVar2 != (undefined8 *)0x0);
  }
switchD_0010f4b2_default:
  return;
}

Assistant:

void ares_free_data(void *dataptr)
{
  while (dataptr != NULL) {
    struct ares_data *ptr;
    void             *next_data = NULL;

#ifdef __INTEL_COMPILER
#  pragma warning(push)
#  pragma warning(disable : 1684)
    /* 1684: conversion from pointer to same-sized integral type */
#endif

    ptr = (void *)((char *)dataptr - offsetof(struct ares_data, data));

#ifdef __INTEL_COMPILER
#  pragma warning(pop)
#endif

    if (ptr->mark != ARES_DATATYPE_MARK) {
      return;
    }

    switch (ptr->type) {
      case ARES_DATATYPE_MX_REPLY:
        next_data = ptr->data.mx_reply.next;
        ares_free(ptr->data.mx_reply.host);
        break;

      case ARES_DATATYPE_SRV_REPLY:
        next_data = ptr->data.srv_reply.next;
        ares_free(ptr->data.srv_reply.host);
        break;

      case ARES_DATATYPE_URI_REPLY:
        next_data = ptr->data.uri_reply.next;
        ares_free(ptr->data.uri_reply.uri);
        break;

      case ARES_DATATYPE_TXT_REPLY:
      case ARES_DATATYPE_TXT_EXT:
        next_data = ptr->data.txt_reply.next;
        ares_free(ptr->data.txt_reply.txt);
        break;

      case ARES_DATATYPE_ADDR_NODE:
        next_data = ptr->data.addr_node.next;
        break;

      case ARES_DATATYPE_ADDR_PORT_NODE:
        next_data = ptr->data.addr_port_node.next;
        break;

      case ARES_DATATYPE_NAPTR_REPLY:
        next_data = ptr->data.naptr_reply.next;
        ares_free(ptr->data.naptr_reply.flags);
        ares_free(ptr->data.naptr_reply.service);
        ares_free(ptr->data.naptr_reply.regexp);
        ares_free(ptr->data.naptr_reply.replacement);
        break;

      case ARES_DATATYPE_SOA_REPLY:
        ares_free(ptr->data.soa_reply.nsname);
        ares_free(ptr->data.soa_reply.hostmaster);
        break;

      case ARES_DATATYPE_CAA_REPLY:
        next_data = ptr->data.caa_reply.next;
        ares_free(ptr->data.caa_reply.property);
        ares_free(ptr->data.caa_reply.value);
        break;

      default:
        return;
    }

    ares_free(ptr);
    dataptr = next_data;
  }
}